

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall
doctest::anon_unknown_14::XmlReporter::test_case_end(XmlReporter *this,CurrentTestCaseStats *st)

{
  XmlWriter *this_00;
  allocator local_83;
  allocator local_82;
  allocator local_81;
  string local_80;
  int local_5c;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_80,"OverallResultsAsserts",&local_81);
  this_00 = &this->xml;
  XmlWriter::startElement(this_00,&local_80);
  std::__cxx11::string::string((string *)&local_58,"successes",&local_82);
  local_5c = st->numAssertsCurrentTest - st->numAssertsFailedCurrentTest;
  XmlWriter::writeAttribute<int>(this_00,&local_58,&local_5c);
  std::__cxx11::string::string((string *)&local_38,"failures",&local_83);
  XmlWriter::writeAttribute<int>(this_00,&local_38,&st->numAssertsFailedCurrentTest);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_80);
  if (this->opt->duration == true) {
    std::__cxx11::string::string((string *)&local_80,"duration",(allocator *)&local_58);
    XmlWriter::writeAttribute<double>(this_00,&local_80,&st->seconds);
    std::__cxx11::string::~string((string *)&local_80);
  }
  if (this->tc->m_expected_failures != 0) {
    std::__cxx11::string::string((string *)&local_80,"expected_failures",(allocator *)&local_58);
    XmlWriter::writeAttribute<int>(this_00,&local_80,&this->tc->m_expected_failures);
    std::__cxx11::string::~string((string *)&local_80);
  }
  XmlWriter::endElement(this_00);
  XmlWriter::endElement(this_00);
  return;
}

Assistant:

void test_case_end(const CurrentTestCaseStats& st) override {
            xml.startElement("OverallResultsAsserts")
                    .writeAttribute("successes",
                                    st.numAssertsCurrentTest - st.numAssertsFailedCurrentTest)
                    .writeAttribute("failures", st.numAssertsFailedCurrentTest);
            if(opt.duration)
                xml.writeAttribute("duration", st.seconds);
            if(tc->m_expected_failures)
                xml.writeAttribute("expected_failures", tc->m_expected_failures);
            xml.endElement();

            xml.endElement();
        }